

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_btst_8_s_ix(void)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = m68ki_read_imm_8();
  uVar2 = OPER_AY_IX_8();
  m68ki_cpu.not_z_flag = 1 << ((byte)uVar1 & 7) & uVar2;
  return;
}

Assistant:

static void m68k_op_btst_8_s_ix(void)
{
	uint bit = OPER_I_8() & 7;

	FLAG_Z = OPER_AY_IX_8() & (1 << bit);
}